

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O3

void __thiscall dg::AllMaxPath::compute(AllMaxPath *this,CDGraph *graph,CDNode *target)

{
  unsigned_short *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer puVar5;
  pointer ppCVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  pointer ppCVar9;
  CDNode *pCVar10;
  pointer puVar11;
  CDNode *pred;
  QueueLIFO<dg::CDNode_*> queue;
  CDNode *local_a0;
  CDNode *local_98;
  ulong local_90;
  _Deque_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_> local_88;
  
  puVar11 = (graph->_nodes).
            super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = (graph->_nodes).
           super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a0 = target;
  if (puVar11 != puVar5) {
    do {
      local_88._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)
           (puVar11->_M_t).super___uniq_ptr_impl<dg::CDNode,_std::default_delete<dg::CDNode>_>._M_t.
           super__Tuple_impl<0UL,_dg::CDNode_*,_std::default_delete<dg::CDNode>_>.
           super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl;
      iVar2 = *(int *)((long)&(((CDNode *)local_88._M_impl.super__Deque_impl_data._M_map)->
                              super_ElemWithEdges<dg::CDNode>)._successors + 8);
      iVar3 = *(int *)&(((CDNode *)local_88._M_impl.super__Deque_impl_data._M_map)->
                       super_ElemWithEdges<dg::CDNode>)._successors;
      pmVar7 = std::__detail::
               _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,(key_type *)&local_88);
      pmVar7->counter = (unsigned_short)((uint)(iVar2 - iVar3) >> 3);
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar5);
  }
  pmVar7 = std::__detail::
           _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_a0);
  uVar4 = local_a0->_id;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)(ulong)(uVar4 & 0xffffffc0);
  pmVar8 = std::
           map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                         *)pmVar7,(key_type *)&local_88);
  *pmVar8 = *pmVar8 | 1L << ((char)uVar4 - (char)local_88._M_impl.super__Deque_impl_data._M_map &
                            0x3fU);
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::_M_initialize_map(&local_88,0);
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<dg::CDNode*,std::allocator<dg::CDNode*>>::_M_push_back_aux<dg::CDNode*const&>
              ((deque<dg::CDNode*,std::allocator<dg::CDNode*>> *)&local_88,&local_a0);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_a0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pCVar10 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x3f];
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        pCVar10 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur[-1];
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      ppCVar6 = (pCVar10->super_ElemWithEdges<dg::CDNode>)._predecessors.
                super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppCVar9 = (pCVar10->super_ElemWithEdges<dg::CDNode>)._predecessors.
                     super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                     super__Vector_impl_data._M_start; ppCVar9 != ppCVar6; ppCVar9 = ppCVar9 + 1) {
        local_98 = *ppCVar9;
        pmVar7 = std::__detail::
                 _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::AllMaxPath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this,&local_98);
        puVar1 = &pmVar7->counter;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          uVar4 = local_a0->_id;
          local_90 = (ulong)(uVar4 & 0xffffffc0);
          pmVar8 = std::
                   map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   ::operator[]((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                                 *)pmVar7,&local_90);
          *pmVar8 = *pmVar8 | 1L << ((char)uVar4 - (char)local_90 & 0x3fU);
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<dg::CDNode*,std::allocator<dg::CDNode*>>::_M_push_back_aux<dg::CDNode*const&>
                      ((deque<dg::CDNode*,std::allocator<dg::CDNode*>> *)&local_88,&local_98);
          }
          else {
            *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_98;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void compute(CDGraph &graph, CDNode *target) {
        // initialize nodes
        for (auto *nd : graph) {
            data[nd].counter = nd->successors().size();
        }

        // initialize the search
        data[target].colors.set(target->getID());
        ADT::QueueLIFO<CDNode *> queue;
        queue.push(target);

        // search!
        while (!queue.empty()) {
            auto *node = queue.pop();
            assert(data[node].colors.get(target->getID()) &&
                   "A non-colored node in queue");

            for (auto *pred : node->predecessors()) {
                auto &D = data[pred];
                --D.counter;
                if (D.counter == 0) {
                    D.colors.set(target->getID());
                    queue.push(pred);
                }
            }
        }
    }